

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar_transform.cpp
# Opt level: O0

void anon_unknown.dwarf_1e9d7::inverseTransform<double>
               (vector<double,_std::allocator<double>_> *input,
               vector<double,_std::allocator<double>_> *output,size_t width,size_t height)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *pvVar2;
  size_type sVar3;
  undefined8 uVar4;
  double *pdVar5;
  long lVar6;
  ulong in_RCX;
  ulong in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar7;
  double *outputYEnd;
  size_t halfHeight;
  double *outputX;
  double *inputXEnd;
  double *inputX;
  double *outputXEnd;
  double *outputX_1;
  double *inputX_1;
  size_t halfWidth;
  double *outputY;
  double *inputYEnd;
  double *inputY;
  vector<double,_std::allocator<double>_> temp;
  double coefficient;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff48;
  imageException *in_stack_ffffffffffffff50;
  double *local_a8;
  double *local_98;
  double *local_88;
  double *local_80;
  double *local_70;
  double *local_60;
  allocator_type local_51 [25];
  double local_38;
  ulong local_20;
  ulong local_18;
  vector<double,_std::allocator<double>_> *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff30);
  if (!bVar1) {
    this = (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::size(local_8);
    pvVar2 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(local_10);
    if (this == pvVar2) {
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_8);
      if (((sVar3 == local_18 * local_20) && ((local_18 & 1) == 0)) && ((local_20 & 1) == 0)) {
        dVar7 = std::sqrt(SUB648(ZEXT464(0x40000000),0));
        local_38 = (double)(1.0 / SUB84(dVar7,0));
        std::vector<double,_std::allocator<double>_>::size(local_8);
        __a = local_51;
        std::allocator<double>::allocator((allocator<double> *)0x114d77);
        std::vector<double,_std::allocator<double>_>::vector(this,in_stack_ffffffffffffff38,__a);
        std::allocator<double>::~allocator((allocator<double> *)0x114d9d);
        local_60 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x114daa);
        pdVar5 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x114dbf);
        sVar3 = std::vector<double,_std::allocator<double>_>::size(local_8);
        local_70 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x114df5);
        for (; local_60 != pdVar5 + sVar3; local_60 = local_60 + local_18) {
          local_80 = local_60;
          for (local_88 = local_70; local_88 != local_70 + local_18; local_88 = local_88 + 2) {
            *local_88 = (*local_80 - local_80[local_18 >> 1]) * local_38;
            local_88[1] = (*local_80 + local_80[local_18 >> 1]) * local_38;
            local_80 = local_80 + 1;
          }
          local_70 = local_70 + local_18;
        }
        local_98 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x114f42);
        pdVar5 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x114f54);
        pdVar5 = pdVar5 + local_18;
        local_a8 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x114f75);
        lVar6 = (local_20 >> 1) * local_18;
        for (; local_98 != pdVar5; local_98 = local_98 + 1) {
          local_60 = local_98;
          for (local_70 = local_a8; local_70 != local_a8 + local_20 * local_18;
              local_70 = local_70 + local_18 * 2) {
            *local_70 = (*local_60 - local_60[lVar6]) * local_38;
            local_70[local_18] = (*local_60 + local_60[lVar6]) * local_38;
            local_60 = local_60 + local_18;
          }
          local_a8 = local_a8 + 1;
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)__a);
        return;
      }
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void inverseTransform( const std::vector< _Type > & input, std::vector< _Type > & output, size_t width, size_t height )
    {
        if ( input.empty() || input.size() != output.size() || input.size() != width * height || (width % 2) != 0 || (height % 2) != 0 )
            throw imageException( "Incorrect input parameters for Haar inverse transform" );

        // Inverse Haar Matrix
        // | 1/sqrt(2) -1/sqrt(2) |
        // | 1/sqrt(2)  1/sqrt(2) |

        // Having 2 pixel intensities x and y we would have new values
        // a = x * (1 / sqrt(2)) - y * (1 / sqrt(2)) = (x - y) * (1 / sqrt(2))
        // b = x * (1 / sqrt(2)) + y * (1 / sqrt(2)) = (x + y) * (1 / sqrt(2))

        const _Type coefficient = 1.0f / std::sqrt(2.0f);
        std::vector< _Type > temp( input.size() );

        // Transform by X
        const _Type * inputY    = input.data();
        const _Type * inputYEnd = input.data() + input.size();
        _Type       * outputY   = temp.data();

        const size_t halfWidth = width / 2;

        for ( ; inputY != inputYEnd; inputY += width, outputY += width ) {
            const _Type * inputX     = inputY;
            _Type       * outputX    = outputY;
            const _Type * outputXEnd = outputY + width;
            for( ; outputX != outputXEnd; ++inputX, outputX += 2 ) {
                *(outputX    ) = (*(inputX) - *(inputX + halfWidth)) * coefficient;
                *(outputX + 1) = (*(inputX) + *(inputX + halfWidth)) * coefficient;
            }
        }

        // Transform by Y
        const _Type * inputX    = temp.data();
        const _Type * inputXEnd = temp.data() + width;
        _Type       * outputX   = output.data();

        const size_t halfHeight = (height / 2) * width;

        for ( ; inputX != inputXEnd; ++inputX, ++outputX ) {
            inputY     = inputX;
            outputY    = outputX;
            const _Type * outputYEnd = outputX + height * width;
            for( ; outputY != outputYEnd; inputY += width, outputY += 2 * width ) {
                *(outputY        ) = (*(inputY) - *(inputY + halfHeight)) * coefficient;
                *(outputY + width) = (*(inputY) + *(inputY + halfHeight)) * coefficient;
            }
        }
    }